

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O2

int TIFFWriteDirectoryTagCheckedIfd8Array
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint32_t count,
              uint64_t *value)

{
  int iVar1;
  
  if (0x1fffffff < count) {
    __assert_fail("count < 0x20000000",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirwrite.c"
                  ,0xb29,
                  "int TIFFWriteDirectoryTagCheckedIfd8Array(TIFF *, uint32_t *, TIFFDirEntry *, uint16_t, uint32_t, uint64_t *)"
                 );
  }
  if ((tif->tif_flags >> 0x13 & 1) != 0) {
    if ((char)tif->tif_flags < '\0') {
      TIFFSwabArrayOfLong8(value,(ulong)count);
    }
    iVar1 = TIFFWriteDirectoryTagData(tif,ndir,dir,tag,0x12,count,count * 8,value);
    return iVar1;
  }
  __assert_fail("tif->tif_flags & TIFF_BIGTIFF",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirwrite.c"
                ,0xb2b,
                "int TIFFWriteDirectoryTagCheckedIfd8Array(TIFF *, uint32_t *, TIFFDirEntry *, uint16_t, uint32_t, uint64_t *)"
               );
}

Assistant:

static int TIFFWriteDirectoryTagCheckedIfd8Array(TIFF *tif, uint32_t *ndir,
                                                 TIFFDirEntry *dir,
                                                 uint16_t tag, uint32_t count,
                                                 uint64_t *value)
{
    assert(count < 0x20000000);
    assert(sizeof(uint64_t) == 8);
    assert(tif->tif_flags & TIFF_BIGTIFF);
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabArrayOfLong8(value, count);
    return (TIFFWriteDirectoryTagData(tif, ndir, dir, tag, TIFF_IFD8, count,
                                      count * 8, value));
}